

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_crypt_xts
              (mbedtls_aes_xts_context *ctx,int mode,size_t length,uchar *data_unit,uchar *input,
              uchar *output)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uchar *puVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uchar tmp [16];
  uchar tweak [16];
  uchar prev_tweak [16];
  
  if (length - 0x1000001 < 0xffffffffff00000f) {
    return -0x22;
  }
  iVar1 = mbedtls_aes_crypt_ecb(&ctx->tweak,1,data_unit,tweak);
  if (iVar1 == 0) {
    uVar5 = (uint)length & 0xf;
    uVar6 = (ulong)uVar5;
    uVar3 = length >> 4;
    while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
      if ((uVar6 != 0 && mode == 0) && uVar3 == 0) {
        prev_tweak[0] = tweak[0];
        prev_tweak[1] = tweak[1];
        prev_tweak[2] = tweak[2];
        prev_tweak[3] = tweak[3];
        prev_tweak[4] = tweak[4];
        prev_tweak[5] = tweak[5];
        prev_tweak[6] = tweak[6];
        prev_tweak[7] = tweak[7];
        prev_tweak[8] = tweak[8];
        prev_tweak[9] = tweak[9];
        prev_tweak[10] = tweak[10];
        prev_tweak[0xb] = tweak[0xb];
        prev_tweak[0xc] = tweak[0xc];
        prev_tweak[0xd] = tweak[0xd];
        prev_tweak[0xe] = tweak[0xe];
        prev_tweak[0xf] = tweak[0xf];
        mbedtls_gf128mul_x_ble(tweak,tweak);
      }
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        tmp[lVar2] = tweak[lVar2] ^ input[lVar2];
      }
      iVar1 = mbedtls_aes_crypt_ecb(&ctx->crypt,mode,tmp,tmp);
      if (iVar1 != 0) {
        return iVar1;
      }
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        output[lVar2] = tweak[lVar2] ^ tmp[lVar2];
      }
      mbedtls_gf128mul_x_ble(tweak,tweak);
      output = output + 0x10;
      input = input + 0x10;
    }
    if (uVar6 == 0) {
      iVar1 = 0;
    }
    else {
      puVar4 = tweak;
      if (mode == 0) {
        puVar4 = prev_tweak;
      }
      for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        output[uVar3] = output[uVar3 - 0x10];
        tmp[uVar3] = puVar4[uVar3] ^ input[uVar3];
      }
      lVar2 = (0x10 - (ulong)(uVar5 * 2)) + uVar3;
      while (bVar7 = lVar2 != 0, lVar2 = lVar2 + -1, bVar7) {
        tmp[uVar6] = puVar4[uVar6] ^ output[uVar6 - 0x10];
        uVar6 = uVar6 + 1;
      }
      iVar1 = mbedtls_aes_crypt_ecb(&ctx->crypt,mode,tmp,tmp);
      if (iVar1 == 0) {
        iVar1 = 0;
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          output[lVar2 + -0x10] = puVar4[lVar2] ^ tmp[lVar2];
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_aes_crypt_xts( mbedtls_aes_xts_context *ctx,
                           int mode,
                           size_t length,
                           const unsigned char data_unit[16],
                           const unsigned char *input,
                           unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t blocks = length / 16;
    size_t leftover = length % 16;
    unsigned char tweak[16];
    unsigned char prev_tweak[16];
    unsigned char tmp[16];

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( mode == MBEDTLS_AES_ENCRYPT ||
                      mode == MBEDTLS_AES_DECRYPT );
    AES_VALIDATE_RET( data_unit != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    /* Data units must be at least 16 bytes long. */
    if( length < 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* NIST SP 800-38E disallows data units larger than 2**20 blocks. */
    if( length > ( 1 << 20 ) * 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* Compute the tweak. */
    ret = mbedtls_aes_crypt_ecb( &ctx->tweak, MBEDTLS_AES_ENCRYPT,
                                 data_unit, tweak );
    if( ret != 0 )
        return( ret );

    while( blocks-- )
    {
        size_t i;

        if( leftover && ( mode == MBEDTLS_AES_DECRYPT ) && blocks == 0 )
        {
            /* We are on the last block in a decrypt operation that has
             * leftover bytes, so we need to use the next tweak for this block,
             * and this tweak for the lefover bytes. Save the current tweak for
             * the leftovers and then update the current tweak for use on this,
             * the last full block. */
            memcpy( prev_tweak, tweak, sizeof( tweak ) );
            mbedtls_gf128mul_x_ble( tweak, tweak );
        }

        for( i = 0; i < 16; i++ )
            tmp[i] = input[i] ^ tweak[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return( ret );

        for( i = 0; i < 16; i++ )
            output[i] = tmp[i] ^ tweak[i];

        /* Update the tweak for the next block. */
        mbedtls_gf128mul_x_ble( tweak, tweak );

        output += 16;
        input += 16;
    }

    if( leftover )
    {
        /* If we are on the leftover bytes in a decrypt operation, we need to
         * use the previous tweak for these bytes (as saved in prev_tweak). */
        unsigned char *t = mode == MBEDTLS_AES_DECRYPT ? prev_tweak : tweak;

        /* We are now on the final part of the data unit, which doesn't divide
         * evenly by 16. It's time for ciphertext stealing. */
        size_t i;
        unsigned char *prev_output = output - 16;

        /* Copy ciphertext bytes from the previous block to our output for each
         * byte of cyphertext we won't steal. At the same time, copy the
         * remainder of the input for this final round (since the loop bounds
         * are the same). */
        for( i = 0; i < leftover; i++ )
        {
            output[i] = prev_output[i];
            tmp[i] = input[i] ^ t[i];
        }

        /* Copy ciphertext bytes from the previous block for input in this
         * round. */
        for( ; i < 16; i++ )
            tmp[i] = prev_output[i] ^ t[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return ret;

        /* Write the result back to the previous block, overriding the previous
         * output we copied. */
        for( i = 0; i < 16; i++ )
            prev_output[i] = tmp[i] ^ t[i];
    }

    return( 0 );
}